

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Get(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *root,size_t *unresolvedTokenIndex)

{
  uint uVar1;
  Data *pDVar2;
  Data *pDVar3;
  ushort uVar4;
  long lVar5;
  Token *pTVar6;
  MemberIterator m;
  undefined8 local_38;
  
  if (this->tokenCount_ != 0) {
    pTVar6 = this->tokens_;
    lVar5 = -(long)pTVar6;
    do {
      uVar4 = (root->data_).f.flags & 7;
      if (uVar4 == 4) {
        uVar1 = pTVar6->index;
        if (((ulong)uVar1 == 0xffffffff) || ((root->data_).s.length <= uVar1)) goto LAB_00107533;
        root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((ulong)uVar1 * 0x10 + ((ulong)(root->data_).s.str & 0xffffffffffff));
      }
      else {
        if (uVar4 != 3) {
LAB_00107533:
          if (unresolvedTokenIndex != (size_t *)0x0) {
            *unresolvedTokenIndex = -((long)&this->tokens_->name + lVar5) >> 4;
          }
          return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)0x0;
        }
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)root);
        pDVar2 = &root->data_;
        pDVar3 = &root->data_;
        root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)(local_38 + 0x10);
        if (local_38 == (ulong)(pDVar3->s).length * 0x20 + ((ulong)(pDVar2->s).str & 0xffffffffffff)
           ) goto LAB_00107533;
      }
      pTVar6 = pTVar6 + 1;
      lVar5 = lVar5 + -0x10;
    } while (pTVar6 != this->tokens_ + this->tokenCount_);
  }
  return root;
}

Assistant:

ValueType* Get(ValueType& root, size_t* unresolvedTokenIndex = 0) const {
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
            case kObjectType:
                {
                    typename ValueType::MemberIterator m = v->FindMember(GenericStringRef<Ch>(t->name, t->length));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                continue;
            case kArrayType:
                if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                    break;
                v = &((*v)[t->index]);
                continue;
            default:
                break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return 0;
        }
        return v;
    }